

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O3

void __thiscall mario::EventLoop::wakeup(EventLoop *this)

{
  byte bVar1;
  ssize_t msg;
  Writer *pWVar2;
  uint64_t one;
  undefined8 local_90;
  Writer local_88;
  
  local_90 = 1;
  msg = write(this->_wakeupFd,&local_90,8);
  if (msg != 8) {
    local_88._vptr_Writer = (_func_int **)&PTR__Writer_00133ae0;
    local_88.m_msg = (LogMessage *)0x0;
    local_88.m_level = Fatal;
    local_88.m_file =
         "/workspace/llm4binary/github/license_all_cmakelists_25/yichenluan[P]Mario/mario/net/EventLoop.cpp"
    ;
    local_88.m_line = 0x89;
    local_88.m_func = "void mario::EventLoop::wakeup()";
    local_88.m_verboseLevel = 0;
    local_88.m_logger = (Logger *)0x0;
    local_88.m_proceed = false;
    local_88.m_messageBuilder.m_logger = (Logger *)0x0;
    local_88.m_messageBuilder.m_containerLogSeperator = "";
    local_88.m_dispatchAction = NormalLog;
    local_88.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pWVar2 = el::base::Writer::construct(&local_88,1,"default");
    bVar1 = pWVar2->m_proceed;
    if ((bool)bVar1 == true) {
      el::base::MessageBuilder::operator<<(&pWVar2->m_messageBuilder,"EventLoop::wakeup() writes ");
      bVar1 = pWVar2->m_proceed;
    }
    if ((bVar1 & 1) != 0) {
      el::base::MessageBuilder::operator<<(&pWVar2->m_messageBuilder,msg);
      bVar1 = pWVar2->m_proceed;
    }
    if ((bVar1 & 1) != 0) {
      el::base::MessageBuilder::operator<<(&pWVar2->m_messageBuilder," bytes instead of 8");
    }
    el::base::Writer::~Writer(&local_88);
  }
  return;
}

Assistant:

void EventLoop::wakeup() {
    uint64_t one = 1;
    ssize_t n = ::write(_wakeupFd, &one, sizeof(one));
    if (n != sizeof(one)) {
        LOG(FATAL) << "EventLoop::wakeup() writes " << n << " bytes instead of 8";
    }
}